

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD3Importer::ValidateSurfaceHeaderOffsets(MD3Importer *this,Surface *pcSurf)

{
  DeadlyImportError *this_00;
  Logger *pLVar1;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Surface *pSStack_18;
  int32_t ofs;
  Surface *pcSurf_local;
  MD3Importer *this_local;
  
  local_1c = (int)pcSurf - (int)this->mBuffer;
  pSStack_18 = pcSurf;
  pcSurf_local = (Surface *)this;
  if ((ulong)(pcSurf->OFS_TRIANGLES + local_1c) + (ulong)pcSurf->NUM_TRIANGLES * 0xc <=
      (ulong)this->fileSize) {
    if ((ulong)(pcSurf->OFS_SHADERS + local_1c) + (ulong)pcSurf->NUM_SHADER * 0x44 <=
        (ulong)this->fileSize) {
      if ((ulong)(pcSurf->OFS_ST + local_1c) + (ulong)pcSurf->NUM_VERTICES * 8 <=
          (ulong)this->fileSize) {
        if ((ulong)(pcSurf->OFS_XYZNORMAL + local_1c) + (ulong)pcSurf->NUM_VERTICES * 8 <=
            (ulong)this->fileSize) {
          if (0x2000 < pcSurf->NUM_TRIANGLES) {
            pLVar1 = DefaultLogger::get();
            Logger::warn(pLVar1,"MD3: Quake III triangle limit exceeded");
          }
          if (0x100 < pSStack_18->NUM_SHADER) {
            pLVar1 = DefaultLogger::get();
            Logger::warn(pLVar1,"MD3: Quake III shader limit exceeded");
          }
          if (0x1000 < pSStack_18->NUM_VERTICES) {
            pLVar1 = DefaultLogger::get();
            Logger::warn(pLVar1,"MD3: Quake III vertex limit exceeded");
          }
          if (0x400 < pSStack_18->NUM_FRAMES) {
            pLVar1 = DefaultLogger::get();
            Logger::warn(pLVar1,"MD3: Quake III frame limit exceeded");
          }
          return;
        }
      }
    }
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Invalid MD3 surface header: some offsets are outside the file",
             &local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MD3Importer::ValidateSurfaceHeaderOffsets(const MD3::Surface* pcSurf)
{
    // Calculate the relative offset of the surface
    const int32_t ofs = int32_t((const unsigned char*)pcSurf-this->mBuffer);

    // Check whether all data chunks are inside the valid range
    if (pcSurf->OFS_TRIANGLES + ofs + pcSurf->NUM_TRIANGLES * sizeof(MD3::Triangle) > fileSize  ||
        pcSurf->OFS_SHADERS + ofs + pcSurf->NUM_SHADER * sizeof(MD3::Shader) > fileSize         ||
        pcSurf->OFS_ST + ofs + pcSurf->NUM_VERTICES * sizeof(MD3::TexCoord) > fileSize          ||
        pcSurf->OFS_XYZNORMAL + ofs + pcSurf->NUM_VERTICES * sizeof(MD3::Vertex) > fileSize)    {

        throw DeadlyImportError("Invalid MD3 surface header: some offsets are outside the file");
    }

    // Check whether all requirements for Q3 files are met. We don't
    // care, but probably someone does.
    if (pcSurf->NUM_TRIANGLES > AI_MD3_MAX_TRIANGLES) {
        ASSIMP_LOG_WARN("MD3: Quake III triangle limit exceeded");
    }

    if (pcSurf->NUM_SHADER > AI_MD3_MAX_SHADERS) {
        ASSIMP_LOG_WARN("MD3: Quake III shader limit exceeded");
    }

    if (pcSurf->NUM_VERTICES > AI_MD3_MAX_VERTS) {
        ASSIMP_LOG_WARN("MD3: Quake III vertex limit exceeded");
    }

    if (pcSurf->NUM_FRAMES > AI_MD3_MAX_FRAMES) {
        ASSIMP_LOG_WARN("MD3: Quake III frame limit exceeded");
    }
}